

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

char * yajl_lex_error_to_string(yajl_lex_error error)

{
  yajl_lex_error error_local;
  char *local_8;
  
  switch(error) {
  case yajl_lex_e_ok:
    local_8 = "ok, no error";
    break;
  case yajl_lex_string_invalid_utf8:
    local_8 = "invalid bytes in UTF8 string.";
    break;
  case yajl_lex_string_invalid_escaped_char:
    local_8 = "inside a string, \'\\\' occurs before a character which it may not.";
    break;
  case yajl_lex_string_invalid_json_char:
    local_8 = "invalid character inside string.";
    break;
  case yajl_lex_string_invalid_hex_char:
    local_8 = "invalid (non-hex) character occurs after \'\\u\' inside string.";
    break;
  case yajl_lex_invalid_char:
    local_8 = "invalid char in json text.";
    break;
  case yajl_lex_invalid_string:
    local_8 = "invalid string in json text.";
    break;
  case yajl_lex_missing_integer_after_decimal:
    local_8 = "malformed number, a digit is required after the decimal point.";
    break;
  case yajl_lex_missing_integer_after_exponent:
    local_8 = "malformed number, a digit is required after the exponent.";
    break;
  case yajl_lex_missing_integer_after_minus:
    local_8 = "malformed number, a digit is required after the minus sign.";
    break;
  case yajl_lex_unallowed_comment:
    local_8 = "probable comment found in input text, comments are not enabled.";
    break;
  default:
    local_8 = "unknown error code";
  }
  return local_8;
}

Assistant:

const char *
yajl_lex_error_to_string(yajl_lex_error error)
{
    switch (error) {
        case yajl_lex_e_ok:
            return "ok, no error";
        case yajl_lex_string_invalid_utf8:
            return "invalid bytes in UTF8 string.";
        case yajl_lex_string_invalid_escaped_char:
            return "inside a string, '\\' occurs before a character "
                   "which it may not.";
        case yajl_lex_string_invalid_json_char:
            return "invalid character inside string.";
        case yajl_lex_string_invalid_hex_char:
            return "invalid (non-hex) character occurs after '\\u' inside "
                   "string.";
        case yajl_lex_invalid_char:
            return "invalid char in json text.";
        case yajl_lex_invalid_string:
            return "invalid string in json text.";
        case yajl_lex_missing_integer_after_exponent:
            return "malformed number, a digit is required after the exponent.";
        case yajl_lex_missing_integer_after_decimal:
            return "malformed number, a digit is required after the "
                   "decimal point.";
        case yajl_lex_missing_integer_after_minus:
            return "malformed number, a digit is required after the "
                   "minus sign.";
        case yajl_lex_unallowed_comment:
            return "probable comment found in input text, comments are "
                   "not enabled.";
        default: return "unknown error code";
    }
}